

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MT.h
# Opt level: O1

int GetLatestData2MT(MT *pMT,MTDATA *pMTData)

{
  ushort uVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  MTDATA *pValue;
  ushort uVar9;
  char *__s;
  int iVar10;
  int OutputSettings;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  uchar databuf [2048];
  int local_95c;
  double local_958;
  double *local_950;
  double local_948;
  double local_940;
  double local_938;
  MT *local_930;
  double *local_928;
  double *local_920;
  double *local_918;
  double *local_910;
  double *local_908;
  double *local_900;
  double *local_8f8;
  double *local_8f0;
  double *local_8e8;
  double *local_8e0;
  double *local_8d8;
  double *local_8d0;
  double *local_8c8;
  double *local_8c0;
  double *local_8b8;
  MTDATA *local_8b0;
  double *local_8a8;
  double *local_8a0;
  MTDATA *local_898;
  double *local_890;
  double *local_888;
  MTDATA *local_880;
  double *local_878;
  double *local_870;
  MTDATA *local_868;
  double *local_860;
  MTDATA *local_858;
  MTDATA *local_850;
  double *local_848;
  double *local_840;
  ushort local_838;
  byte abStack_836 [3];
  ushort auStack_833 [2];
  uchar auStack_82f [2047];
  
  memset(&local_838,0,0x800);
  local_95c = 0;
  iVar6 = GetLatestMTMessageMT(pMT,0xff,0x36,(uchar *)&local_838,0x800,&local_95c);
  iVar7 = 1;
  if (iVar6 == 0) {
    memset(pMTData,0,0x130);
    if (local_95c < 3) {
      __s = "Error reading data from a MT : Empty MTDATA2 message. ";
LAB_001ba833:
      iVar7 = 1;
      puts(__s);
    }
    else {
      if (2 < local_95c) {
        local_840 = &pMTData->Vel_X;
        local_848 = &pMTData->Vel_Y;
        local_850 = (MTDATA *)&pMTData->Vel_Z;
        local_858 = (MTDATA *)&pMTData->Alt;
        local_860 = &pMTData->Lat;
        local_868 = (MTDATA *)&pMTData->Long;
        local_870 = &pMTData->magX;
        local_878 = &pMTData->magY;
        local_880 = (MTDATA *)&pMTData->magZ;
        local_888 = &pMTData->gyrX;
        local_890 = &pMTData->gyrY;
        local_898 = (MTDATA *)&pMTData->gyrZ;
        local_8a0 = &pMTData->accX;
        local_8a8 = &pMTData->accY;
        local_8b0 = (MTDATA *)&pMTData->accZ;
        local_8b8 = &pMTData->a;
        local_8c0 = &pMTData->b;
        local_950 = &pMTData->c;
        local_8c8 = &pMTData->d;
        local_8d0 = &pMTData->e;
        local_8d8 = &pMTData->f;
        local_8e0 = &pMTData->g;
        local_8e8 = &pMTData->h;
        local_8f0 = &pMTData->i;
        local_8f8 = &pMTData->roll;
        local_900 = &pMTData->pitch;
        local_908 = &pMTData->yaw;
        local_910 = &pMTData->q0;
        local_918 = &pMTData->q1;
        local_920 = &pMTData->q2;
        local_928 = &pMTData->q3;
        iVar7 = 0;
        iVar6 = 3;
        do {
          pdVar5 = local_910;
          lVar8 = (long)iVar7;
          iVar10 = (uint)*(byte *)((long)&local_838 + lVar8 + 2) + iVar6;
          if (local_95c < iVar10) {
            __s = "Error reading data from a MT : Bad packet. ";
            goto LAB_001ba833;
          }
          uVar9 = *(ushort *)((long)&local_838 + lVar8) << 8;
          uVar1 = *(ushort *)((long)&local_838 + lVar8) >> 8;
          OutputSettings = (uint)(uVar9 | uVar1) * 4;
          uVar9 = uVar9 | uVar1 & 0xfff0;
          if (uVar9 < 0x5020) {
            if (uVar9 < 0x2010) {
              pValue = pMTData;
              if (uVar9 == 0x810) goto LAB_001ba7f5;
              if (uVar9 == 0x1010) {
                uVar9 = *(ushort *)((long)&local_838 + lVar8 + 5);
                (pMTData->UTCTime).Nanoseconds =
                     CONCAT13(*(undefined1 *)((long)&local_838 + (long)iVar6),
                              CONCAT12(*(undefined1 *)((long)&local_838 + lVar8 + 4),
                                       uVar9 << 8 | uVar9 >> 8));
                uVar9 = *(ushort *)((long)&local_838 + lVar8 + 7);
                (pMTData->UTCTime).Year = uVar9 << 8 | uVar9 >> 8;
                (pMTData->UTCTime).Month = *(uchar *)((long)&local_838 + lVar8 + 9);
                (pMTData->UTCTime).Day = *(uchar *)((long)&local_838 + lVar8 + 10);
                (pMTData->UTCTime).Hour = *(uchar *)((long)&local_838 + lVar8 + 0xb);
                (pMTData->UTCTime).Minute = *(uchar *)((long)&local_838 + lVar8 + 0xc);
                (pMTData->UTCTime).Seconds = *(uchar *)((long)&local_838 + lVar8 + 0xd);
                (pMTData->UTCTime).Valid = *(uchar *)((long)&local_838 + lVar8 + 0xe);
                iVar10 = iVar7 + 0xf;
              }
              else if (uVar9 == 0x1020) {
                pMTData->TS = CONCAT11(*(undefined1 *)((long)&local_838 + (long)iVar6),
                                       *(undefined1 *)((long)&local_838 + lVar8 + 4));
                iVar10 = iVar7 + 5;
              }
            }
            else if (uVar9 < 0x2030) {
              if (uVar9 == 0x2010) {
                local_930 = pMT;
                iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_910);
                pdVar4 = local_918;
                iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_918);
                pdVar3 = local_920;
                iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_920);
                pdVar2 = local_928;
                iVar10 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_928);
                dVar15 = *pdVar5;
                dVar14 = *pdVar4;
                dVar11 = *pdVar3;
                local_958 = *pdVar2;
                dVar12 = dVar15 + dVar15;
                local_938 = dVar15 * dVar15 + dVar15 * dVar15;
                local_940 = atan2((dVar11 + dVar11) * local_958 + dVar12 * dVar14,
                                  local_958 * local_958 + local_958 * local_958 + local_938 + -1.0);
                local_948 = dVar14 + dVar14;
                dVar13 = local_948 * local_958 - dVar11 * dVar12;
                dVar15 = -1.0;
                if ((-1.0 <= dVar13) && (dVar15 = 1.0, dVar13 <= 1.0)) {
                  dVar15 = dVar13;
                }
                dVar13 = asin(dVar15);
                dVar11 = atan2(local_948 * dVar11 + dVar12 * local_958,
                               local_938 + dVar14 * dVar14 + dVar14 * dVar14 + -1.0);
                pMT = local_930;
                pMTData->roll = (local_940 * 180.0) / 3.141592653589793;
                pMTData->pitch = (dVar13 * -180.0) / 3.141592653589793;
                pMTData->yaw = (dVar11 * 180.0) / 3.141592653589793;
                dVar14 = local_930->rollorientation + local_940;
                dVar15 = local_930->rollp1;
                dVar12 = cos(local_930->rollp2 + local_940);
                dVar15 = fmod(dVar12 * dVar15 + dVar14,6.283185307179586);
                dVar15 = fmod(dVar15 + 9.42477796076938,6.283185307179586);
                pMTData->Roll = dVar15 + -3.141592653589793;
                dVar15 = pMT->pitchorientation;
                dVar14 = pMT->pitchp1;
                dVar12 = cos(pMT->pitchp2 - dVar13);
                dVar15 = fmod(dVar12 * dVar14 + (dVar15 - dVar13),6.283185307179586);
                dVar15 = fmod(dVar15 + 9.42477796076938,6.283185307179586);
                pMTData->Pitch = dVar15 + -3.141592653589793;
                dVar15 = pMT->yaworientation;
                dVar14 = pMT->yawp1;
                dVar12 = cos(dVar11 + pMT->yawp2);
                dVar15 = fmod(dVar12 * dVar14 + dVar15 + dVar11,6.283185307179586);
                dVar15 = fmod(dVar15 + 9.42477796076938,6.283185307179586);
                pMTData->Yaw = dVar15 + -3.141592653589793;
              }
              else if (uVar9 == 0x2020) {
                iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8b8);
                iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8c0);
                iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_950);
                iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8c8);
                iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8d0);
                pdVar2 = local_8d8;
                iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8d8);
                iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8e0);
                iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8e8);
                pdVar5 = local_8f0;
                iVar10 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8f0);
                dVar11 = atan2(*pdVar2,*pdVar5);
                dVar15 = *local_950;
                dVar14 = -1.0;
                if ((-1.0 <= dVar15) && (dVar14 = 1.0, dVar15 <= 1.0)) {
                  dVar14 = dVar15;
                }
                dVar12 = asin(dVar14);
                dVar13 = atan2(pMTData->b,pMTData->a);
                pMTData->roll = (dVar11 * 180.0) / 3.141592653589793;
                pMTData->pitch = (dVar12 * -180.0) / 3.141592653589793;
                pMTData->yaw = (dVar13 * 180.0) / 3.141592653589793;
                dVar15 = pMT->rollorientation;
                local_958 = pMT->rollp1;
                dVar14 = cos(pMT->rollp2 + dVar11);
                dVar15 = fmod(dVar14 * local_958 + dVar15 + dVar11,6.283185307179586);
                dVar15 = fmod(dVar15 + 9.42477796076938,6.283185307179586);
                pMTData->Roll = dVar15 + -3.141592653589793;
                dVar15 = pMT->pitchorientation;
                dVar14 = pMT->pitchp1;
                dVar11 = cos(pMT->pitchp2 - dVar12);
                dVar15 = fmod(dVar11 * dVar14 + (dVar15 - dVar12),6.283185307179586);
                dVar15 = fmod(dVar15 + 9.42477796076938,6.283185307179586);
                pMTData->Pitch = dVar15 + -3.141592653589793;
                dVar15 = pMT->yaworientation;
                dVar14 = pMT->yawp1;
                dVar11 = cos(dVar13 + pMT->yawp2);
                dVar15 = fmod(dVar11 * dVar14 + dVar15 + dVar13,6.283185307179586);
                dVar15 = fmod(dVar15 + 9.42477796076938,6.283185307179586);
                pMTData->Yaw = dVar15 + -3.141592653589793;
              }
            }
            else if (uVar9 == 0x2030) {
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8f8);
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_900);
              iVar10 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_908);
              dVar11 = (pMTData->roll * 3.141592653589793) / 180.0;
              dVar13 = (pMTData->pitch * 3.141592653589793) / 180.0;
              dVar16 = (pMTData->yaw * 3.141592653589793) / 180.0;
              dVar15 = pMT->rollorientation;
              dVar14 = pMT->rollp1;
              dVar12 = cos(dVar11 + pMT->rollp2);
              dVar15 = fmod(dVar12 * dVar14 + dVar15 + dVar11,6.283185307179586);
              dVar15 = fmod(dVar15 + 9.42477796076938,6.283185307179586);
              pMTData->Roll = dVar15 + -3.141592653589793;
              dVar15 = pMT->pitchorientation;
              dVar14 = pMT->pitchp1;
              dVar11 = cos(dVar13 + pMT->pitchp2);
              dVar15 = fmod(dVar11 * dVar14 + dVar15 + dVar13,6.283185307179586);
              dVar15 = fmod(dVar15 + 9.42477796076938,6.283185307179586);
              pMTData->Pitch = dVar15 + -3.141592653589793;
              dVar15 = pMT->yaworientation;
              dVar14 = pMT->yawp1;
              dVar11 = cos(dVar16 + pMT->yawp2);
              dVar15 = fmod(dVar11 * dVar14 + dVar15 + dVar16,6.283185307179586);
              dVar15 = fmod(dVar15 + 9.42477796076938,6.283185307179586);
              pMTData->Yaw = dVar15 + -3.141592653589793;
            }
            else if (uVar9 == 0x4020) {
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8a0);
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_8a8);
              pValue = local_8b0;
              goto LAB_001ba7f5;
            }
          }
          else if (uVar9 < 0xb020) {
            if (uVar9 < 0x8020) {
              pValue = local_858;
              if (uVar9 != 0x5020) {
                if (uVar9 != 0x5040) goto LAB_001ba7fd;
                iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_860);
                pValue = local_868;
              }
            }
            else {
              if (uVar9 != 0x8020) {
                if (uVar9 == 0xb010) {
                  pMTData->Ain_1 =
                       CONCAT11(*(undefined1 *)((long)&local_838 + (long)iVar6),
                                *(undefined1 *)((long)&local_838 + lVar8 + 4));
                  goto LAB_001ba76d;
                }
                goto LAB_001ba7fd;
              }
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_888);
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_890);
              pValue = local_898;
            }
LAB_001ba7f5:
            iVar10 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,&pValue->temp);
          }
          else if (uVar9 < 0xd010) {
            if (uVar9 == 0xb020) {
              pMTData->Ain_2 =
                   CONCAT11(*(undefined1 *)((long)&local_838 + (long)iVar6),
                            *(undefined1 *)((long)&local_838 + lVar8 + 4));
LAB_001ba76d:
              iVar10 = iVar7 + 5;
            }
            else if (uVar9 == 0xc020) {
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_870);
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_878);
              pValue = local_880;
              goto LAB_001ba7f5;
            }
          }
          else {
            if (uVar9 == 0xd010) {
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_840);
              iVar6 = ConvertToDoubleMT(OutputSettings,(uchar *)&local_838,iVar6,local_848);
              pValue = local_850;
              goto LAB_001ba7f5;
            }
            if (uVar9 == 0xe010) {
              pMTData->Status = *(uchar *)((long)&local_838 + (long)iVar6);
              iVar10 = iVar7 + 4;
            }
          }
LAB_001ba7fd:
          iVar7 = iVar10;
          iVar6 = iVar7 + 3;
        } while (iVar6 <= local_95c);
      }
      memcpy(&pMT->LastMTData,pMTData,0x130);
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

inline int GetLatestData2MT(MT* pMT, MTDATA* pMTData)
{
	unsigned char databuf[MAX_NB_BYTES_MT];
	int nbdatabytes = 0;
	int offset = 0;
	int dataidentifier = 0;
	int size = 0;
	int precisionoutputsettings = 0;
	uShort_MT us;
	uInt_MT ul;
	double roll = 0, pitch = 0, yaw = 0;

	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMTMessageMT(pMT, ADDR_MT, MTDATA2_MID, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		return EXIT_FAILURE;	
	}

	// Analyze data.

	memset(pMTData, 0, sizeof(MTDATA));

	if (nbdatabytes < 3) 
	{
		printf("Error reading data from a MT : Empty MTDATA2 message. \n");
		return EXIT_FAILURE;
	}

	// Might not be good if all data are not at the same output frequency...?

	while (nbdatabytes >= offset+3) 
	{
		// Get Data Identifier and Size of the packet.
		us.c[0] = databuf[1+offset];
		us.c[1] = databuf[0+offset];
		dataidentifier = us.v;
		size = databuf[2+offset];
		offset += 3;
		if (nbdatabytes < offset+size) 
		{
			printf("Error reading data from a MT : Bad packet. \n");
			return EXIT_FAILURE;
		}
		precisionoutputsettings = (dataidentifier<<2);
		switch (dataidentifier & XDI_FullTypeMask)
		{
		case XDI_Temperature:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->temp);
			break;
		case XDI_UtcTime:
			ul.c[0] = databuf[3+offset];
			ul.c[1] = databuf[2+offset];
			ul.c[2] = databuf[1+offset];
			ul.c[3] = databuf[0+offset];
			pMTData->UTCTime.Nanoseconds = ul.v;
			offset += 4;
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->UTCTime.Year = us.v;
			offset += 2;
			pMTData->UTCTime.Month = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Day = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Hour = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Minute = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Seconds = databuf[offset];
			offset += 1;
			pMTData->UTCTime.Valid = databuf[offset];
			offset += 1;
			break;
		case XDI_PacketCounter:
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->TS = us.v;
			offset += 2;
			break;
		case XDI_Quaternion:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q0);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q1);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q2);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->q3);
			quaternion2euler(pMTData->q0, pMTData->q1, pMTData->q2, pMTData->q3, &roll, &pitch, &yaw);
			//yaw = fmod_2PI(yaw-M_PI/2.0); // Coordinate system different from legacy mode...
			
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;

			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
			pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
			pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
			break;
		case XDI_EulerAngles:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->roll);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->pitch);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->yaw);
			roll = pMTData->roll*M_PI/180.0;
			pitch = pMTData->pitch*M_PI/180.0;
			yaw = pMTData->yaw*M_PI/180.0;
			//yaw = fmod_2PI(yaw-M_PI/2.0); // Coordinate system different from legacy mode...
	
			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
			pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
			pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
			break;
		case XDI_RotationMatrix:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->a);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->b);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->c);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->d);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->e);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->f);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->g);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->h);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->i);
			roll = atan2(pMTData->f,pMTData->i);
			pitch = -asin(constrain(pMTData->c, -1, 1)); // Attempt to avoid potential NAN...
			yaw = atan2(pMTData->b,pMTData->a);
			//yaw = fmod_2PI(yaw-M_PI/2.0); // Coordinate system different from legacy mode...
		
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pMTData->roll = roll*180.0/M_PI;
			pMTData->pitch = pitch*180.0/M_PI;
			pMTData->yaw = yaw*180.0/M_PI;

			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pMTData->Roll = fmod_2PI(roll+pMT->rollorientation+pMT->rollp1*cos(roll+pMT->rollp2));
			pMTData->Pitch = fmod_2PI(pitch+pMT->pitchorientation+pMT->pitchp1*cos(pitch+pMT->pitchp2));
			pMTData->Yaw = fmod_2PI(yaw+pMT->yaworientation+pMT->yawp1*cos(yaw+pMT->yawp2));
			break;
		case XDI_Acceleration:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->accX);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->accY);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->accZ);
			break;
		case XDI_RateOfTurn:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->gyrX);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->gyrY);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->gyrZ);
			break;
		case XDI_MagneticField:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->magX);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->magY);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->magZ);
			break;
		case XDI_StatusByte:
			pMTData->Status = databuf[offset];
			offset += 1;
			break;
		case XDI_AnalogIn1:
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_1 = us.v;
			offset += 2;
			break;
		case XDI_AnalogIn2:
			us.c[0] = databuf[1+offset];
			us.c[1] = databuf[0+offset];
			pMTData->Ain_2 = us.v;
			offset += 2;
			break;
		case XDI_LatLon:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Lat);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Long);
			break;
		case XDI_AltitudeEllipsoid:
			// Altitude Mean Sea Level or WGS84 in MTDATA message?
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Alt);
			break;
		case XDI_VelocityXYZ:
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Vel_X);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Vel_Y);
			offset = ConvertToDoubleMT(precisionoutputsettings, databuf, offset, &pMTData->Vel_Z);
			break;
		default:
			// Skipping an unknown packet...
			offset += size;
			break;
		}
	}

	pMT->LastMTData = *pMTData;

	return EXIT_SUCCESS;
}